

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void insert_flipped_container
               (roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,
               uint16_t lb_end)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  array_container_t *src;
  container_t *c;
  undefined6 in_register_00000082;
  int iVar4;
  uint8_t local_3e;
  uint8_t local_3d;
  uint local_3c;
  container_t *local_38;
  
  local_3c = (uint)CONCAT62(in_register_00000082,lb_end);
  uVar2 = ra_get_index(x1_arr,hb);
  uVar3 = ra_get_index(ans_arr,hb);
  if ((int)uVar2 < 0) {
    c = container_range_of_ones((uint)lb_start,(local_3c & 0xffff) + 1,&local_3e);
  }
  else {
    local_3d = x1_arr->typecodes[uVar2 & 0xffff];
    iVar4 = (local_3c & 0xffff) + 1;
    src = (array_container_t *)container_unwrap_shared(x1_arr->containers[uVar2 & 0xffff],&local_3d)
    ;
    local_38 = (container_t *)0x0;
    if (local_3d == '\x03') {
      iVar4 = run_container_negation_range((run_container_t *)src,(uint)lb_start,iVar4,&local_38);
      local_3e = (uint8_t)iVar4;
    }
    else if (local_3d == '\x02') {
      _Var1 = array_container_negation_range(src,(uint)lb_start,iVar4,&local_38);
      local_3e = '\x02' - _Var1;
    }
    else {
      if (local_3d != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1848,
                      "container_t *container_not_range(const container_t *, uint8_t, uint32_t, uint32_t, uint8_t *)"
                     );
      }
      _Var1 = bitset_container_negation_range
                        ((bitset_container_t *)src,(uint)lb_start,iVar4,&local_38);
      local_3e = '\x02' - _Var1;
    }
    c = local_38;
    iVar4 = container_get_cardinality(local_38,local_3e);
    if (iVar4 == 0) {
      container_free(c,local_3e);
      return;
    }
  }
  ra_insert_new_key_value_at(ans_arr,~uVar3,hb,c,local_3e);
  return;
}

Assistant:

static void insert_flipped_container(roaring_array_t *ans_arr,
                                     const roaring_array_t *x1_arr, uint16_t hb,
                                     uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, i, &ctype_in);
        flipped_container =
            container_not_range(container_to_flip, ctype_in, (uint32_t)lb_start,
                                (uint32_t)(lb_end + 1), &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}